

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<true,_true,_false>::move_
          (DaTrie<true,_true,_false> *this,uint32_t node_pos,uint32_t base,Edge *edge,Query *query)

{
  size_t sVar1;
  pointer pNVar2;
  Bc BVar3;
  uint8_t *puVar4;
  pointer pBVar5;
  uint node_pos_00;
  uint node_pos_01;
  Bc BVar6;
  size_t sVar7;
  ulong uVar8;
  uint8_t *__begin2;
  Edge src_edge;
  Edge local_138;
  
  pBVar5 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  BVar6 = pBVar5[node_pos];
  sVar1 = edge->size_;
  if (sVar1 != 0) {
    puVar4 = edge->labels_;
    do {
      node_pos_01 = BVar6._0_4_ & 0x7fffffff ^ (uint)edge->labels_[0];
      node_pos_00 = edge->labels_[0] ^ base;
      fix_(this,node_pos_00,&this->blocks_);
      pBVar5 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar5[node_pos_00] = pBVar5[node_pos_01];
      pNVar2 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pNVar2[node_pos_00] = pNVar2[node_pos_01];
      memset(&local_138,0,0x108);
      edge_(this,node_pos_01,&local_138,0x100);
      if (local_138.size_ != 0) {
        BVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                super__Vector_impl_data._M_start[node_pos_01];
        sVar7 = 0;
        do {
          uVar8 = (ulong)local_138.labels_[sVar7] ^ (ulong)(BVar3._0_4_ & 0x7fffffff);
          pBVar5 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pBVar5[uVar8] =
               (Bc)((ulong)pBVar5[uVar8] & 0x80000000ffffffff |
                   (ulong)(node_pos_00 & 0x7fffffff) << 0x20);
          sVar7 = sVar7 + 1;
        } while (local_138.size_ != sVar7);
      }
      unfix_(this,node_pos_01,&this->blocks_);
      if (node_pos_01 == query->node_pos_) {
        query->node_pos_ = node_pos_00;
      }
      edge = (Edge *)(edge->labels_ + 1);
    } while (edge != (Edge *)(puVar4 + sVar1));
    pBVar5 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    BVar6 = pBVar5[node_pos];
  }
  pBVar5[node_pos] = (Bc)((ulong)(base & 0x7fffffff) | (ulong)BVar6 & 0xffffffff00000000);
  return;
}

Assistant:

void move_(uint32_t node_pos, uint32_t base, const Edge& edge, Query& query) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());
    assert(0 < edge.size());

    auto orig_base = bc_[node_pos].base();

    for (auto label : edge) {
      auto src_node_pos = orig_base ^label;
      auto dst_node_pos = base ^label;

      fix_(dst_node_pos, blocks_);
      bc_[dst_node_pos] = bc_[src_node_pos];
      if (WithNLM) {
        node_links_[dst_node_pos] = node_links_[src_node_pos];
      }

      Edge src_edge;
      edge_(src_node_pos, src_edge);

      auto src_base = bc_[src_node_pos].base();
      for (auto src_label : src_edge) {
        auto src_child_pos = src_base ^src_label;
        bc_[src_child_pos].set_check(dst_node_pos);
      }

      unfix_(src_node_pos, blocks_);

      if (src_node_pos == query.node_pos()) {
        query.set_node_pos(dst_node_pos);
      }
    }

    bc_[node_pos].set_base(base);
  }